

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotHLines<double>(char *label_id,double *ys,int count,int offset,int stride)

{
  double dVar1;
  int iVar2;
  ImPlotPlot *pIVar3;
  double dVar4;
  double dVar5;
  ImPlotRange *pIVar6;
  ImPlotContext *pIVar7;
  bool bVar8;
  ImU32 col;
  ImDrawList *DrawList;
  int i;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ImPlotLimits lims;
  TransformerLinLin local_8c;
  GetterXRefYs<double> local_88;
  GetterXRefYs<double> local_68;
  ImPlotLimits local_48;
  
  bVar8 = BeginItem(label_id,0);
  if (bVar8) {
    GetPlotLimits(&local_48,-1);
    pIVar7 = GImPlot;
    local_68.XRef = local_48.X.Min;
    if (count == 0) {
      local_88.Offset = 0;
    }
    else {
      local_88.Offset = (offset % count + count) % count;
    }
    local_88.XRef = local_48.X.Max;
    if ((0 < count) && (GImPlot->FitThisFrame != false)) {
      pIVar3 = GImPlot->CurrentPlot;
      iVar2 = pIVar3->CurrentYAxis;
      pIVar6 = GImPlot->ExtentsY;
      iVar9 = 0;
      do {
        dVar1 = *(double *)
                 ((long)ys +
                 (long)(((local_88.Offset + iVar9) % count + count) % count) * (long)stride);
        if (((ulong)ABS(dVar1) < 0x7ff0000000000000) &&
           ((0.0 < dVar1 || ((pIVar3->YAxis[iVar2].Flags & 0x20U) == 0)))) {
          dVar4 = pIVar6[iVar2].Min;
          dVar5 = pIVar7->ExtentsY[iVar2].Max;
          uVar10 = -(ulong)(dVar1 < dVar4);
          uVar11 = -(ulong)(dVar5 < dVar1);
          pIVar6[iVar2].Min = (double)(~uVar10 & (ulong)dVar4 | (ulong)dVar1 & uVar10);
          pIVar7->ExtentsY[iVar2].Max = (double)(~uVar11 & (ulong)dVar5 | (ulong)dVar1 & uVar11);
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    local_88.Ys = ys;
    local_88.Count = count;
    local_88.Stride = stride;
    local_68.Ys = ys;
    local_68.Count = count;
    local_68.Offset = local_88.Offset;
    local_68.Stride = stride;
    DrawList = GetPlotDrawList();
    if ((pIVar7->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar7->NextItemData).Colors);
      iVar2 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar2]) {
      case 0:
        local_8c.YAxis = iVar2;
        RenderLineSegments<ImPlot::GetterXRefYs<double>,ImPlot::GetterXRefYs<double>,ImPlot::TransformerLinLin>
                  (&local_68,&local_88,&local_8c,DrawList,(pIVar7->NextItemData).LineWeight,col);
        break;
      case 1:
        local_8c.YAxis = iVar2;
        RenderLineSegments<ImPlot::GetterXRefYs<double>,ImPlot::GetterXRefYs<double>,ImPlot::TransformerLogLin>
                  (&local_68,&local_88,(TransformerLogLin *)&local_8c,DrawList,
                   (pIVar7->NextItemData).LineWeight,col);
        break;
      case 2:
        local_8c.YAxis = iVar2;
        RenderLineSegments<ImPlot::GetterXRefYs<double>,ImPlot::GetterXRefYs<double>,ImPlot::TransformerLinLog>
                  (&local_68,&local_88,(TransformerLinLog *)&local_8c,DrawList,
                   (pIVar7->NextItemData).LineWeight,col);
        break;
      case 3:
        local_8c.YAxis = iVar2;
        RenderLineSegments<ImPlot::GetterXRefYs<double>,ImPlot::GetterXRefYs<double>,ImPlot::TransformerLogLog>
                  (&local_68,&local_88,(TransformerLogLog *)&local_8c,DrawList,
                   (pIVar7->NextItemData).LineWeight,col);
      }
    }
    pIVar7 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar7->NextItemData);
    pIVar7->PreviousItem = pIVar7->CurrentItem;
    pIVar7->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotHLines(const char* label_id, const T* ys, int count, int offset, int stride) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        const ImPlotLimits lims = GetPlotLimits();
        GetterXRefYs<T> get_min(lims.X.Min,ys,count,offset,stride);
        GetterXRefYs<T> get_max(lims.X.Max,ys,count,offset,stride);
        if (FitThisFrame()) {
            for (int i = 0; i < get_min.Count; ++i)
                FitPointY(get_min(i).y);
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_min, get_max, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_min, get_max, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_min, get_max, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_min, get_max, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        EndItem();
    }
}